

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall CPP::WriteInitialization::acceptLayout(WriteInitialization *this,DomLayout *node)

{
  DomProperty *this_00;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QLatin1StringView latin1_07;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Kind KVar7;
  QTextStream *pQVar8;
  DomLayout **ppDVar9;
  DomProperty **ppDVar10;
  void *pvVar11;
  long in_RDI;
  char *str;
  long in_FS_OFFSET;
  uint unaff_retaddr;
  DomPropertyList *in_stack_00000008;
  QString *in_stack_00000010;
  QString *in_stack_00000018;
  WriteInitialization *in_stack_00000020;
  DomProperty *p_4;
  DomProperty *p_3;
  DomProperty *p_2;
  DomProperty *p_1;
  DomProperty *p;
  DomPropertyList *__range2;
  bool bottom;
  bool right;
  bool top;
  bool left;
  int marginType;
  bool suppressMarginDefault;
  bool isGroupBox;
  bool oldLayoutProperties;
  QString numberNull;
  QString propertyName;
  iterator __end2;
  iterator __begin2;
  DomPropertyList newPropList;
  DomPropertyList propList;
  DomPropertyMap properties;
  QString varName;
  QString className;
  DomLayout *in_stack_fffffffffffffb98;
  DomProperty *this_01;
  DomProperty *in_stack_fffffffffffffba0;
  QList<DomProperty_*> *in_stack_fffffffffffffba8;
  QList<DomProperty_*> *in_stack_fffffffffffffbb0;
  QString *this_02;
  QString *defaultValue;
  DomLayout *in_stack_fffffffffffffbc0;
  QString *value;
  Driver *in_stack_fffffffffffffbc8;
  QString *setFunction;
  DomWidget *in_stack_fffffffffffffbd0;
  QString *varName_00;
  WriteInitialization *in_stack_fffffffffffffbd8;
  WriteInitialization *this_03;
  undefined8 in_stack_fffffffffffffc58;
  DomPropertyMap *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6c;
  undefined1 in_stack_fffffffffffffc6d;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 in_stack_fffffffffffffc6f;
  QString *in_stack_fffffffffffffc70;
  LayoutDefaultHandler *in_stack_fffffffffffffc78;
  QTextStream *in_stack_fffffffffffffd00;
  QString local_240;
  undefined1 local_228 [48];
  QString local_1f8;
  QString local_1e0;
  QString local_1c8;
  QChar local_1aa;
  QString local_1a8 [5];
  QLatin1StringView local_128;
  QLatin1StringView local_118;
  QLatin1StringView local_108;
  QLatin1StringView local_f8;
  qsizetype local_e8;
  Data *local_e0;
  char16_t *local_d8;
  DomProperty **local_d0;
  iterator local_c8;
  iterator local_c0;
  qsizetype local_b8;
  Data *local_b0;
  QString *local_a8;
  qsizetype local_a0;
  undefined8 local_98;
  Data *local_90;
  QString local_88;
  QLatin1StringView local_70;
  undefined8 local_48;
  QString local_40;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_28.d.size = -0x5555555555555556;
  DomLayout::attributeClass(in_stack_fffffffffffffb98);
  local_40.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_40.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_40.d.size = -0x5555555555555556;
  Driver::findOrInsertLayout(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  DomLayout::elementProperty(in_stack_fffffffffffffb98);
  propertyMap((QList<DomProperty_*> *)in_stack_fffffffffffffbc8);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x1356e2);
  local_70 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
  QHash<QString,_DomProperty_*>::value<QLatin1String,_true>
            ((QHash<QString,_DomProperty_*> *)in_stack_fffffffffffffba8,
             (QLatin1String *)in_stack_fffffffffffffba0);
  pQVar8 = (QTextStream *)
           QTextStream::operator<<(*(QTextStream **)(in_RDI + 0x18),(QString *)(in_RDI + 0x28));
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&local_40);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8," = ");
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)language::operatorNew);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&local_28);
  QTextStream::operator<<(pQVar8,'(');
  ppDVar9 = QStack<DomLayout_*>::top((QStack<DomLayout_*> *)0x1357a1);
  if (*ppDVar9 == (DomLayout *)0x0) {
    in_stack_fffffffffffffc78 = *(LayoutDefaultHandler **)(in_RDI + 0x18);
    in_stack_fffffffffffffc70 = *(QString **)(in_RDI + 0x10);
    QStack<DomWidget_*>::top((QStack<DomWidget_*> *)0x1357da);
    Driver::findOrInsertWidget((Driver *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffc78,&local_88);
    QString::~QString((QString *)0x135814);
  }
  pQVar8 = (QTextStream *)QTextStream::operator<<(*(QTextStream **)(in_RDI + 0x18),")");
  QTextStream::operator<<(pQVar8,(QString *)language::eol);
  QStack<DomLayout_*>::top((QStack<DomLayout_*> *)0x13584c);
  this_01 = *(DomProperty **)(in_RDI + 0x18);
  LayoutDefaultHandler::writeProperties
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
             (QString *)
             CONCAT17(in_stack_fffffffffffffc6f,
                      CONCAT16(in_stack_fffffffffffffc6e,
                               CONCAT15(in_stack_fffffffffffffc6d,
                                        CONCAT14(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68
                                                )))),in_stack_fffffffffffffc60,
             (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffc58 >> 0x18,0),in_stack_fffffffffffffd00);
  *(undefined4 *)(in_RDI + 0x128) = 3;
  local_a0 = -0x5555555555555556;
  local_98._0_1_ = true;
  local_98._1_7_ = 0xaaaaaaaaaaaaaa;
  local_90 = (Data *)0xaaaaaaaaaaaaaaaa;
  DomLayout::elementProperty((DomLayout *)this_01);
  local_b8 = -0x5555555555555556;
  local_b0 = (Data *)0xaaaaaaaaaaaaaaaa;
  local_a8 = (QString *)0xaaaaaaaaaaaaaaaa;
  QList<DomProperty_*>::QList((QList<DomProperty_*> *)0x135962);
  if ((*(byte *)(in_RDI + 0x210) & 1) != 0) {
    bVar1 = false;
    bVar2 = false;
    bVar3 = false;
    bVar4 = false;
    local_c0.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
    local_c0 = QList<DomProperty_*>::begin((QList<DomProperty_*> *)in_stack_fffffffffffffba0);
    local_c8.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
    local_c8 = QList<DomProperty_*>::end((QList<DomProperty_*> *)in_stack_fffffffffffffba0);
    while( true ) {
      local_d0 = local_c8.i;
      bVar5 = QList<DomProperty_*>::iterator::operator!=(&local_c0,local_c8);
      if (!bVar5) break;
      ppDVar10 = QList<DomProperty_*>::iterator::operator*(&local_c0);
      this_00 = *ppDVar10;
      local_e8 = -0x5555555555555556;
      local_e0 = (Data *)0xaaaaaaaaaaaaaaaa;
      local_d8 = (char16_t *)0xaaaaaaaaaaaaaaaa;
      DomProperty::attributeName(this_01);
      local_f8 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
      bVar6 = ::operator==((QString *)in_stack_fffffffffffffba8,
                           (QLatin1StringView *)in_stack_fffffffffffffba0);
      bVar5 = false;
      if (bVar6) {
        KVar7 = DomProperty::kind(this_00);
        bVar5 = KVar7 == Number;
      }
      if (bVar5) {
        bVar1 = true;
      }
      else {
        local_108 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
        bVar5 = ::operator==((QString *)in_stack_fffffffffffffba8,
                             (QLatin1StringView *)in_stack_fffffffffffffba0);
        bVar6 = false;
        if (bVar5) {
          KVar7 = DomProperty::kind(this_00);
          bVar6 = KVar7 == Number;
        }
        if (bVar6) {
          bVar2 = true;
        }
        else {
          local_118 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0
                                );
          bVar5 = ::operator==((QString *)in_stack_fffffffffffffba8,
                               (QLatin1StringView *)in_stack_fffffffffffffba0);
          bVar6 = false;
          if (bVar5) {
            KVar7 = DomProperty::kind(this_00);
            bVar6 = KVar7 == Number;
          }
          if (bVar6) {
            bVar3 = true;
          }
          else {
            local_128 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffffba8,
                                   (size_t)in_stack_fffffffffffffba0);
            bVar5 = ::operator==((QString *)in_stack_fffffffffffffba8,
                                 (QLatin1StringView *)in_stack_fffffffffffffba0);
            bVar6 = false;
            if (bVar5) {
              KVar7 = DomProperty::kind(this_00);
              bVar6 = KVar7 == Number;
            }
            if (bVar6) {
              bVar4 = true;
            }
          }
        }
      }
      QString::~QString((QString *)0x135c84);
      QList<DomProperty_*>::iterator::operator++(&local_c0);
    }
    if (!bVar1) {
      pvVar11 = operator_new(0x178);
      memset(pvVar11,0,0x178);
      DomProperty::DomProperty(in_stack_fffffffffffffba0);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
      latin1.m_data = (char *)in_stack_fffffffffffffbd8;
      latin1.m_size = (qsizetype)in_stack_fffffffffffffbd0;
      QString::QString((QString *)in_stack_fffffffffffffbb0,latin1);
      DomProperty::setAttributeName(in_stack_fffffffffffffba0,&this_01->m_attr_name);
      QString::~QString((QString *)0x135d52);
      DomProperty::setElementNumber(in_stack_fffffffffffffba0,(int)((ulong)this_01 >> 0x20));
      QList<DomProperty_*>::append((QList<DomProperty_*> *)0x135d76,this_01);
    }
    if (!bVar2) {
      pvVar11 = operator_new(0x178);
      memset(pvVar11,0,0x178);
      DomProperty::DomProperty(in_stack_fffffffffffffba0);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
      latin1_00.m_data = (char *)in_stack_fffffffffffffbd8;
      latin1_00.m_size = (qsizetype)in_stack_fffffffffffffbd0;
      QString::QString((QString *)in_stack_fffffffffffffbb0,latin1_00);
      DomProperty::setAttributeName(in_stack_fffffffffffffba0,&this_01->m_attr_name);
      QString::~QString((QString *)0x135e32);
      DomProperty::setElementNumber(in_stack_fffffffffffffba0,(int)((ulong)this_01 >> 0x20));
      QList<DomProperty_*>::append((QList<DomProperty_*> *)0x135e56,this_01);
    }
    if (!bVar3) {
      pvVar11 = operator_new(0x178);
      memset(pvVar11,0,0x178);
      DomProperty::DomProperty(in_stack_fffffffffffffba0);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
      latin1_01.m_data = (char *)in_stack_fffffffffffffbd8;
      latin1_01.m_size = (qsizetype)in_stack_fffffffffffffbd0;
      QString::QString((QString *)in_stack_fffffffffffffbb0,latin1_01);
      DomProperty::setAttributeName(in_stack_fffffffffffffba0,&this_01->m_attr_name);
      QString::~QString((QString *)0x135f12);
      DomProperty::setElementNumber(in_stack_fffffffffffffba0,(int)((ulong)this_01 >> 0x20));
      QList<DomProperty_*>::append((QList<DomProperty_*> *)0x135f36,this_01);
    }
    if (!bVar4) {
      pvVar11 = operator_new(0x178);
      memset(pvVar11,0,0x178);
      DomProperty::DomProperty(in_stack_fffffffffffffba0);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
      latin1_02.m_data = (char *)in_stack_fffffffffffffbd8;
      latin1_02.m_size = (qsizetype)in_stack_fffffffffffffbd0;
      QString::QString((QString *)in_stack_fffffffffffffbb0,latin1_02);
      DomProperty::setAttributeName(in_stack_fffffffffffffba0,&this_01->m_attr_name);
      QString::~QString((QString *)0x135ff2);
      DomProperty::setElementNumber(in_stack_fffffffffffffba0,(int)((ulong)this_01 >> 0x20));
      QList<DomProperty_*>::append((QList<DomProperty_*> *)0x136016,this_01);
    }
    *(undefined1 *)(in_RDI + 0x210) = 0;
  }
  QList<DomProperty_*>::append(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  writeProperties(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                  unaff_retaddr);
  QList<DomProperty_*>::clear((QList<DomProperty_*> *)in_stack_fffffffffffffba0);
  qDeleteAll<QList<DomProperty*>>((QList<DomProperty_*> *)in_stack_fffffffffffffba0);
  QList<DomProperty_*>::clear((QList<DomProperty_*> *)in_stack_fffffffffffffba0);
  str = (char *)(in_RDI + 0x78);
  QStack<DomLayout_*>::push((QStack<DomLayout_*> *)in_stack_fffffffffffffba0,(DomLayout **)this_01);
  TreeWalker::acceptLayout((TreeWalker *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  QStack<DomLayout_*>::pop((QStack<DomLayout_*> *)0x1360d7);
  local_1a8[0].d.size = -0x5555555555555556;
  local_1a8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1a8[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QChar::QChar<char16_t,_true>(&local_1aa,L'0');
  QString::QString(local_1a8,local_1aa);
  Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_stack_fffffffffffffba0);
  defaultValue = &local_1c8;
  latin1_03.m_data = (char *)in_stack_fffffffffffffbd8;
  latin1_03.m_size = (qsizetype)in_stack_fffffffffffffbd0;
  QString::QString((QString *)in_stack_fffffffffffffbb0,latin1_03);
  this_02 = &local_1e0;
  DomLayout::attributeStretch((DomLayout *)this_01);
  writePropertyList(in_stack_fffffffffffffbd8,&in_stack_fffffffffffffbd0->m_attr_class,
                    (QString *)in_stack_fffffffffffffbc8,&in_stack_fffffffffffffbc0->m_attr_class,
                    defaultValue);
  QString::~QString((QString *)0x1361af);
  QString::~QString((QString *)0x1361b9);
  Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_stack_fffffffffffffba0);
  setFunction = &local_1f8;
  latin1_04.m_data = (char *)in_stack_fffffffffffffbd8;
  latin1_04.m_size = (qsizetype)in_stack_fffffffffffffbd0;
  QString::QString(this_02,latin1_04);
  value = (QString *)(local_228 + 0x18);
  DomLayout::attributeRowStretch((DomLayout *)this_01);
  writePropertyList(in_stack_fffffffffffffbd8,&in_stack_fffffffffffffbd0->m_attr_class,setFunction,
                    value,defaultValue);
  QString::~QString((QString *)0x136244);
  QString::~QString((QString *)0x13624e);
  Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_stack_fffffffffffffba0);
  this_03 = (WriteInitialization *)local_228;
  latin1_05.m_data = (char *)this_03;
  latin1_05.m_size = (qsizetype)in_stack_fffffffffffffbd0;
  QString::QString(this_02,latin1_05);
  varName_00 = &local_240;
  DomLayout::attributeColumnStretch((DomLayout *)this_01);
  writePropertyList(this_03,varName_00,setFunction,value,defaultValue);
  QString::~QString((QString *)0x1362d9);
  QString::~QString((QString *)0x1362e3);
  Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_stack_fffffffffffffba0);
  latin1_06.m_data = (char *)this_03;
  latin1_06.m_size = (qsizetype)varName_00;
  QString::QString(this_02,latin1_06);
  DomLayout::attributeColumnMinimumWidth((DomLayout *)this_01);
  writePropertyList(this_03,varName_00,setFunction,value,defaultValue);
  QString::~QString((QString *)0x13636e);
  QString::~QString((QString *)0x136378);
  Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_stack_fffffffffffffba0);
  latin1_07.m_data = (char *)this_03;
  latin1_07.m_size = (qsizetype)varName_00;
  QString::QString(this_02,latin1_07);
  DomLayout::attributeRowMinimumHeight((DomLayout *)this_01);
  writePropertyList(this_03,varName_00,setFunction,value,defaultValue);
  QString::~QString((QString *)0x136403);
  QString::~QString((QString *)0x13640d);
  QString::~QString((QString *)0x136417);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x136421);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x13642b);
  QHash<QString,_DomProperty_*>::~QHash((QHash<QString,_DomProperty_*> *)in_stack_fffffffffffffba0);
  QString::~QString((QString *)0x136445);
  QString::~QString((QString *)0x136452);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::acceptLayout(DomLayout *node)
{
    const QString className = node->attributeClass();
    const QString varName = m_driver->findOrInsertLayout(node);

    const DomPropertyMap properties = propertyMap(node->elementProperty());
    const bool oldLayoutProperties = properties.value("margin"_L1) != nullptr;

    bool isGroupBox = false;

    m_output << m_indent << varName << " = " << language::operatorNew << className << '(';

    if (!m_layoutChain.top() && !isGroupBox)
        m_output << m_driver->findOrInsertWidget(m_widgetChain.top());

    m_output << ")" << language::eol;

    // Suppress margin on a read child layout
    const bool suppressMarginDefault = m_layoutChain.top();
    int marginType = Use43UiFile;
    if (oldLayoutProperties)
        marginType = m_layoutMarginType;
    m_LayoutDefaultHandler.writeProperties(m_indent, varName, properties, marginType, suppressMarginDefault, m_output);

    m_layoutMarginType = SubLayoutMargin;

    DomPropertyList propList = node->elementProperty();
    DomPropertyList newPropList;
    if (m_layoutWidget) {
        bool left = false;
        bool top = false;
        bool right = false;
        bool bottom = false;
        for (const DomProperty *p : propList) {
            const QString propertyName = p->attributeName();
            if (propertyName == "leftMargin"_L1 && p->kind() == DomProperty::Number)
                left = true;
            else if (propertyName == "topMargin"_L1 && p->kind() == DomProperty::Number)
                top = true;
            else if (propertyName == "rightMargin"_L1 && p->kind() == DomProperty::Number)
                right = true;
            else if (propertyName == "bottomMargin"_L1 && p->kind() == DomProperty::Number)
                bottom = true;
        }
        if (!left) {
            auto *p = new DomProperty();
            p->setAttributeName("leftMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!top) {
            auto *p = new DomProperty();
            p->setAttributeName("topMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!right) {
            auto *p = new DomProperty();
            p->setAttributeName("rightMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!bottom) {
            auto *p = new DomProperty();
            p->setAttributeName("bottomMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        m_layoutWidget = false;
    }

    propList.append(newPropList);

    writeProperties(varName, className, propList, WritePropertyIgnoreMargin|WritePropertyIgnoreSpacing);

    // Clean up again:
    propList.clear();
    qDeleteAll(newPropList);
    newPropList.clear();

    m_layoutChain.push(node);
    TreeWalker::acceptLayout(node);
    m_layoutChain.pop();

    // Stretch? (Unless we are compiling for UIC3)
    const QString numberNull(u'0');
    writePropertyList(varName, "setStretch"_L1, node->attributeStretch(), numberNull);
    writePropertyList(varName, "setRowStretch"_L1, node->attributeRowStretch(), numberNull);
    writePropertyList(varName, "setColumnStretch"_L1, node->attributeColumnStretch(), numberNull);
    writePropertyList(varName, "setColumnMinimumWidth"_L1, node->attributeColumnMinimumWidth(), numberNull);
    writePropertyList(varName, "setRowMinimumHeight"_L1, node->attributeRowMinimumHeight(), numberNull);
}